

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O0

void __thiscall sf::View::reset(View *this,FloatRect *rectangle)

{
  FloatRect *rectangle_local;
  View *this_local;
  
  (this->m_center).x = rectangle->left + rectangle->width / 2.0;
  (this->m_center).y = rectangle->top + rectangle->height / 2.0;
  (this->m_size).x = rectangle->width;
  (this->m_size).y = rectangle->height;
  this->m_rotation = 0.0;
  this->m_transformUpdated = false;
  this->m_invTransformUpdated = false;
  return;
}

Assistant:

void View::reset(const FloatRect& rectangle)
{
    m_center.x = rectangle.left + rectangle.width / 2.f;
    m_center.y = rectangle.top + rectangle.height / 2.f;
    m_size.x   = rectangle.width;
    m_size.y   = rectangle.height;
    m_rotation = 0;

    m_transformUpdated    = false;
    m_invTransformUpdated = false;
}